

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

size_t sparc_Convert(_7zip *zip,uint8_t *buf,size_t size)

{
  uint uVar1;
  int iVar2;
  ulong uStack_28;
  uint32_t instr;
  size_t i;
  size_t size_local;
  uint8_t *buf_local;
  _7zip *zip_local;
  
  for (uStack_28 = 0; uStack_28 < (size & 0xfffffffffffffffc); uStack_28 = uStack_28 + 4) {
    uVar1 = (uint)buf[uStack_28] << 0x18 | (uint)buf[uStack_28 + 1] << 0x10;
    if ((uVar1 >> 0x16 == 0x100) || (uVar1 >> 0x16 == 0x1ff)) {
      uVar1 = (uVar1 | (uint)buf[uStack_28 + 2] << 8 | (uint)buf[uStack_28 + 3]) * 4 -
              (zip->bcj_ip + (int)uStack_28) >> 2;
      iVar2 = 0x40000000 - (uVar1 & 0x400000);
      uVar1 = uVar1 & 0x3fffff;
      buf[uStack_28] = (byte)((uint)iVar2 >> 0x18) | 0x40;
      buf[uStack_28 + 1] = (byte)((uint)iVar2 >> 0x10) | (byte)(uVar1 >> 0x10);
      buf[uStack_28 + 2] = (uint8_t)(uVar1 >> 8);
      buf[uStack_28 + 3] = (uint8_t)uVar1;
    }
  }
  zip->bcj_ip = (int)uStack_28 + zip->bcj_ip;
  return uStack_28;
}

Assistant:

static size_t
sparc_Convert(struct _7zip *zip, uint8_t *buf, size_t size)
{
	// This function was adapted from
	// static size_t bcj_sparc(struct xz_dec_bcj *s, uint8_t *buf, size_t size)
	// in https://git.tukaani.org/xz-embedded.git

	/*
	 * Branch/Call/Jump (BCJ) filter decoders
	 *
	 * Authors: Lasse Collin <lasse.collin@tukaani.org>
	 *          Igor Pavlov <https://7-zip.org/>
	 *
	 * Copyright (C) The XZ Embedded authors and contributors
	 *
	 * Permission to use, copy, modify, and/or distribute this
	 * software for any purpose with or without fee is hereby granted.
	 *
	 * THE SOFTWARE IS PROVIDED "AS IS" AND THE AUTHOR DISCLAIMS ALL
	 * WARRANTIES WITH REGARD TO THIS SOFTWARE INCLUDING ALL IMPLIED
	 * WARRANTIES OF MERCHANTABILITY AND FITNESS. IN NO EVENT SHALL
	 * THE AUTHOR BE LIABLE FOR ANY SPECIAL, DIRECT, INDIRECT, OR
	 * CONSEQUENTIAL DAMAGES OR ANY DAMAGES WHATSOEVER RESULTING FROM
	 * LOSS OF USE, DATA OR PROFITS, WHETHER IN AN ACTION OF CONTRACT,
	 * NEGLIGENCE OR OTHER TORTIOUS ACTION, ARISING OUT OF OR IN
	 * CONNECTION WITH THE USE OR PERFORMANCE OF THIS SOFTWARE.
	 */

	size_t i;
	uint32_t instr;

	size &= ~(size_t)3;

	for (i = 0; i < size; i += 4) {
		instr = (uint32_t)(buf[i] << 24)
			| ((uint32_t)buf[i+1] << 16)
			| ((uint32_t)buf[i+2] << 8)
			| (uint32_t)buf[i+3];

		if ((instr >> 22) == 0x100 || (instr >> 22) == 0x1FF) {
			instr <<= 2;
			instr -= zip->bcj_ip + (uint32_t)i;
			instr >>= 2;
			instr = ((uint32_t)0x40000000 - (instr & 0x400000))
			        | 0x40000000 | (instr & 0x3FFFFF);

			buf[i] = (uint8_t)(instr >> 24);
			buf[i+1] = (uint8_t)(instr >> 16);
			buf[i+2] = (uint8_t)(instr >> 8);
			buf[i+3] = (uint8_t)instr;
		}
	}

	zip->bcj_ip += (uint32_t)i;

	return i;
}